

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactStateMachine.cpp
# Opt level: O1

void __thiscall
iDynTree::ContactStateMachine::ContactStateMachine(ContactStateMachine *this,SchmittParams *s)

{
  _Head_base<0UL,_iDynTree::SchmittTrigger_*,_false> _Var1;
  _Head_base<0UL,_iDynTree::SchmittTrigger_*,_false> this_00;
  pointer *__ptr;
  
  (this->m_contactSchmitt)._M_t.
  super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>.
  _M_t.
  super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
  .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl = (SchmittTrigger *)0x0;
  this->m_previousState = true;
  this->m_currentState = true;
  this_00._M_head_impl = (SchmittTrigger *)operator_new(0x48);
  SchmittTrigger::SchmittTrigger
            (this_00._M_head_impl,s->stableTimeContactBreak,s->stableTimeContactMake,
             s->contactBreakForceThreshold,s->contactMakeForceThreshold);
  _Var1._M_head_impl =
       (this->m_contactSchmitt)._M_t.
       super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
       ._M_t.
       super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
       .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl;
  (this->m_contactSchmitt)._M_t.
  super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>.
  _M_t.
  super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
  .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var1._M_head_impl != (SchmittTrigger *)0x0) {
    operator_delete(_Var1._M_head_impl,0x48);
  }
  ((this->m_contactSchmitt)._M_t.
   super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>.
   _M_t.
   super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
   .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl)->m_currentState =
       this->m_previousState;
  return;
}

Assistant:

ContactStateMachine::ContactStateMachine(const SchmittParams& s) : m_previousState(true), 
                                                                   m_currentState(true)                                                                   
{
    m_contactSchmitt = std::unique_ptr<SchmittTrigger>(new SchmittTrigger(s.stableTimeContactBreak, 
                                                                          s.stableTimeContactMake,
                                                                          s.contactBreakForceThreshold,
                                                                          s.contactMakeForceThreshold));
    m_contactSchmitt.get()->setInitialState(m_previousState);
}